

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lwsac.c
# Opt level: O0

int lwsac_extend(lwsac *head,int amount)

{
  lwsac *plVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  bool bVar5;
  lwsac *bf;
  lwsac_head *lachead;
  int amount_local;
  lwsac *head_local;
  
  if (head == (lwsac *)0x0) {
    __assert_fail("head",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/misc/lwsac/lwsac.c"
                  ,0x4e,"int lwsac_extend(struct lwsac *, int)");
  }
  plVar1 = head[1].next;
  if (plVar1 == (lwsac *)0x0) {
    __assert_fail("bf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/misc/lwsac/lwsac.c"
                  ,0x52,"int lwsac_extend(struct lwsac *, int)");
  }
  sVar4 = plVar1->alloc_size;
  sVar3 = plVar1->ofs;
  sVar2 = lwsac_align((long)amount);
  bVar5 = sVar2 <= sVar4 - sVar3;
  if (bVar5) {
    sVar4 = plVar1->ofs;
    sVar3 = lwsac_align((long)amount);
    memset((void *)((long)&plVar1->next + sVar4),0,sVar3);
    sVar4 = lwsac_align((long)amount);
    plVar1->ofs = sVar4 + plVar1->ofs;
  }
  head_local._4_4_ = (uint)!bVar5;
  return head_local._4_4_;
}

Assistant:

int
lwsac_extend(struct lwsac *head, int amount)
{
	struct lwsac_head *lachead;
	struct lwsac *bf;

	assert(head);
	lachead = (struct lwsac_head *)&head[1];

	bf = lachead->curr;
	assert(bf);

	if (bf->alloc_size - bf->ofs < lwsac_align(amount))
		return 1;

	/* memset so constant folding never sees uninitialized data */

	memset(((uint8_t *)bf) + bf->ofs, 0, lwsac_align(amount));
	bf->ofs += lwsac_align(amount);

	return 0;
}